

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall wasm::Output::Output(Output *this,string *filename,BinaryOption binary)

{
  Output *pOVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  int *piVar5;
  streambuf *psVar6;
  undefined1 local_1e8 [392];
  Output *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  BinaryOption local_38;
  char *local_30;
  
  std::ofstream::ofstream(this);
  local_60 = this;
  std::__cxx11::string::string((string *)&local_58,(string *)filename);
  pOVar1 = local_60;
  local_38 = binary;
  bVar2 = std::operator==(&local_58,"-");
  if ((bVar2) || (local_58._M_string_length == 0)) {
    psVar6 = *(streambuf **)(std::__throw_length_error + *(long *)(std::cout + -0x18));
  }
  else {
    bVar2 = isDebugEnabled("file");
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Opening \'");
      poVar4 = std::operator<<(poVar4,(string *)&local_58);
      std::operator<<(poVar4,"\'\n");
    }
    Path::to_path((PathString *)local_1e8,&local_58);
    std::ofstream::open((string *)pOVar1,(_Ios_Openmode)local_1e8);
    std::__cxx11::string::~string((string *)local_1e8);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      Fatal::Fatal((Fatal *)local_1e8);
      poVar4 = (ostream *)(local_1e8 + 0x10);
      std::operator<<(poVar4,"Failed opening output file \'");
      std::operator<<(poVar4,(string *)&local_58);
      std::operator<<(poVar4,"\': ");
      piVar5 = __errno_location();
      local_30 = strerror(*piVar5);
      Fatal::operator<<((Fatal *)local_1e8,&local_30);
      Fatal::~Fatal((Fatal *)local_1e8);
    }
    psVar6 = (streambuf *)&pOVar1->field_0x8;
  }
  std::ostream::ostream(&this->out,psVar6);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

wasm::Output::Output(const std::string& filename, Flags::BinaryOption binary)
  : outfile(), out([this, filename, binary]() {
      // Ensure a single return at the very end, to avoid clang-tidy warnings
      // about the types of different returns here.
      std::streambuf* buffer;
      if (filename == "-" || filename.empty()) {
        buffer = std::cout.rdbuf();
      } else {
        BYN_TRACE("Opening '" << filename << "'\n");
        std::ios_base::openmode flags =
          std::ofstream::out | std::ofstream::trunc;
        if (binary == Flags::Binary) {
          flags |= std::ofstream::binary;
        }
        outfile.open(wasm::Path::to_path(filename), flags);
        if (!outfile.is_open()) {
          Fatal() << "Failed opening output file '" << filename
                  << "': " << strerror(errno);
        }
        buffer = outfile.rdbuf();
      }
      return buffer;
    }()) {}